

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_list3(sexp ctx,sexp a,sexp b,sexp c)

{
  sexp psVar1;
  sexp_sint_t n;
  sexp res;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_40;
  sexp_gc_var_t local_38;
  
  local_38.var = &local_40;
  local_40 = (sexp)0x43e;
  local_38.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_38;
  local_40 = sexp_list2(ctx,b,c);
  psVar1 = sexp_cons_op(ctx,b,n,a,local_40);
  (ctx->value).context.saves = local_38.next;
  return psVar1;
}

Assistant:

sexp sexp_list3 (sexp ctx, sexp a, sexp b, sexp c) {
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_list2(ctx, b, c);
  res = sexp_cons(ctx, a, res);
  sexp_gc_release1(ctx);
  return res;
}